

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riotUnits.c
# Opt level: O1

void guardAttack(UnitList *guardList,UnitList *inmateList)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  UnitNode *pUVar5;
  UnitNode *pUVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  
  if (guardList == (UnitList *)0x0) {
    pUVar5 = (UnitNode *)0x0;
  }
  else {
    pUVar5 = guardList->head;
  }
  if (inmateList == (UnitList *)0x0) {
    pUVar6 = (UnitNode *)0x0;
  }
  else {
    pUVar6 = inmateList->head;
  }
  do {
    pvVar4 = pUVar5->unit;
    iVar2 = *(int *)((long)pvVar4 + 4);
    iVar3 = *(int *)((long)pvVar4 + 0xc);
    do {
      iVar8 = (int)*(float *)((long)pUVar6->unit + 4);
      iVar9 = (iVar8 + -1) / 0x50 + (iVar2 + -1) / 0x50 + 2;
      iVar7 = (iVar2 - iVar8) + iVar9 * 0x50;
      iVar8 = -iVar9;
      if (0 < iVar9) {
        iVar8 = iVar9;
      }
      iVar9 = -iVar7;
      if (0 < iVar7) {
        iVar9 = iVar7;
      }
      if (iVar9 + iVar8 <= iVar3) {
        piVar1 = (int *)((long)pUVar6->unit + 8);
        *piVar1 = *piVar1 - *(int *)((long)pvVar4 + 8);
      }
      pUVar6 = pUVar6->next;
    } while ((pUVar6 != (UnitNode *)0x0) && (pUVar6->next != (UnitNode *)0x0));
    pUVar5 = pUVar5->next;
  } while ((pUVar5 != (UnitNode *)0x0) && (pUVar5->next != (UnitNode *)0x0));
  return;
}

Assistant:

void guardAttack(struct UnitList *guardList, struct UnitList *inmateList) {
    struct UnitNode *nextInmate;
    struct UnitNode *nextGuard;

    nextGuard = getHead(guardList);
    nextInmate = getHead(inmateList);

    do {
        do {
            if (inRange(nextInmate, nextGuard))
                dealDamage(nextInmate, nextGuard);
            nextInmate = getNext(nextInmate);
        } while (getNext(nextInmate) != NULL);
        nextGuard = getNext(nextGuard);
    } while (getNext(nextGuard) != NULL);
}